

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 gen_ldst(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_i32 val,ea_what what,
                 int index)

{
  int iVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar2;
  TCGContext_conflict2 *tcg_ctx;
  
  if (what == EA_STORE) {
    tcg_ctx_00 = s->uc->tcg_ctx;
    tcg_gen_qemu_st_i32_m68k
              (tcg_ctx_00,val,addr,(ulong)(uint)index,
               *(MemOp_conflict *)(&DAT_00d88520 + (long)opsize * 4));
    pTVar2 = tcg_ctx_00->store_dummy;
  }
  else {
    pTVar2 = gen_load(s,opsize,addr,(uint)(what == EA_LOADS),index);
    iVar1 = s->release_count;
    if (7 < (long)iVar1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                 ,0x91,"s->release_count < MAX_TO_RELEASE");
    }
    s->release_count = iVar1 + 1;
    s->release[iVar1] = pTVar2;
  }
  return pTVar2;
}

Assistant:

static TCGv gen_ldst(DisasContext *s, int opsize, TCGv addr, TCGv val,
                     ea_what what, int index)
{
    if (what == EA_STORE) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;
        gen_store(s, opsize, addr, val, index);
        return tcg_ctx->store_dummy;
    } else {
        return mark_to_release(s, gen_load(s, opsize, addr,
                                           what == EA_LOADS, index));
    }
}